

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O0

void __thiscall
QSequentialAnimationGroupPrivate::animationRemoved
          (QSequentialAnimationGroupPrivate *this,qsizetype index,QAbstractAnimation *anim)

{
  int iVar1;
  parameter_type pVar2;
  parameter_type pVar3;
  QSequentialAnimationGroup *pQVar4;
  parameter_type pQVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *in_RSI;
  QSequentialAnimationGroupPrivate *in_RDI;
  int current;
  qsizetype i;
  qsizetype currentIndex;
  QSequentialAnimationGroup *q;
  undefined4 in_stack_ffffffffffffffa8;
  parameter_type in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *in_stack_ffffffffffffffb8;
  bool intermediate;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  long local_30;
  
  pQVar4 = q_func(in_RDI);
  QAnimationGroupPrivate::animationRemoved
            (&in_RDI->super_QAnimationGroupPrivate,(qsizetype)in_stack_ffffffffffffffb8,
             (QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  pQVar5 = QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
                     ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                       *)0x68b290);
  if (pQVar5 != (parameter_type)0x0) {
    qVar6 = QList<int>::size(&in_RDI->actualDuration);
    if ((long)in_RSI < qVar6) {
      QList<int>::removeAt
                ((QList<int> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    qVar6 = QListSpecialMethodsBase<QAbstractAnimation_*>::
            indexOf<QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>_>
                      ((QListSpecialMethodsBase<QAbstractAnimation_*> *)in_RDI,
                       in_stack_ffffffffffffffb8,
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (qVar6 == -1) {
      QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
                ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                  *)0x68b30a);
      QAnimationGroupPrivate::disconnectUncontrolledAnimation
                ((QAnimationGroupPrivate *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                );
      in_stack_ffffffffffffffb8 = in_RSI;
      qVar7 = QList<QAbstractAnimation_*>::size(&(in_RDI->super_QAnimationGroupPrivate).animations);
      intermediate = SUB81((ulong)in_RDI >> 0x38,0);
      iVar1 = (int)((ulong)qVar6 >> 0x20);
      if ((long)in_stack_ffffffffffffffb8 < qVar7) {
        setCurrentAnimation((QSequentialAnimationGroupPrivate *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),iVar1,
                            intermediate);
      }
      else if ((long)in_RSI < 1) {
        setCurrentAnimation((QSequentialAnimationGroupPrivate *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),iVar1,
                            intermediate);
      }
      else {
        setCurrentAnimation((QSequentialAnimationGroupPrivate *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),iVar1,
                            intermediate);
      }
    }
    else if ((long)in_RSI < (long)in_RDI->currentAnimationIndex) {
      in_RDI->currentAnimationIndex = in_RDI->currentAnimationIndex + -1;
    }
    (in_RDI->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime = 0;
    for (local_30 = 0; local_30 < in_RDI->currentAnimationIndex; local_30 = local_30 + 1) {
      iVar1 = animationActualTotalDuration(in_RDI,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      (in_RDI->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime =
           iVar1 + (in_RDI->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                   currentTime;
    }
    if (qVar6 != -1) {
      QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
                ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                  *)0x68b436);
      QAbstractAnimationPrivate::get((QAbstractAnimation *)0x68b43e);
      pVar2 = ::QObjectCompatProperty::operator_cast_to_int
                        ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                          *)0x68b44d);
      (in_RDI->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime =
           pVar2 + (in_RDI->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                   currentTime;
    }
    iVar1 = (in_RDI->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime;
    pVar3 = QObjectBindableProperty::operator_cast_to_int
                      ((QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                        *)0x68b47b);
    (*(pQVar4->super_QAnimationGroup).super_QAbstractAnimation.super_QObject._vptr_QObject[0xc])();
    QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
    ::operator=((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                 *)CONCAT44(pVar3,iVar1),in_stack_ffffffffffffffac);
  }
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::animationRemoved(qsizetype index, QAbstractAnimation *anim)
{
    Q_Q(QSequentialAnimationGroup);
    QAnimationGroupPrivate::animationRemoved(index, anim);

    if (!currentAnimation)
        return;

    if (actualDuration.size() > index)
        actualDuration.removeAt(index);

    const qsizetype currentIndex = animations.indexOf(currentAnimation);
    if (currentIndex == -1) {
        //we're removing the current animation

        disconnectUncontrolledAnimation(currentAnimation);

        if (index < animations.size())
            setCurrentAnimation(index); //let's try to take the next one
        else if (index > 0)
            setCurrentAnimation(index - 1);
        else// case all animations were removed
            setCurrentAnimation(-1);
    } else if (currentAnimationIndex > index) {
        currentAnimationIndex--;
    }

    // duration of the previous animations up to the current animation
    currentTime = 0;
    for (qsizetype i = 0; i < currentAnimationIndex; ++i) {
        const int current = animationActualTotalDuration(i);
        currentTime += current;
    }

    if (currentIndex != -1) {
        //the current animation is not the one being removed
        //so we add its current time to the current time of this group
        currentTime += QAbstractAnimationPrivate::get(currentAnimation)->totalCurrentTime;
    }

    //let's also update the total current time
    totalCurrentTime = currentTime + loopCount * q->duration();
}